

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O1

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
     send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
               (mbox_t *to,prefix_t *args,suffix_t *args_1,id *args_2,
               work_thread_activity_stats_t *args_3)

{
  atomic_refcounted_t *paVar1;
  abstract_message_box_t *paVar2;
  pointer *__ptr;
  work_thread_activity *local_28;
  work_thread_activity *local_20;
  pointer_____offset_0x10___ *local_18;
  
  paVar2 = to->m_obj;
  details::make_message_instance_impl<false,so_5::stats::messages::work_thread_activity>::
  make<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            ((make_message_instance_impl<false,so_5::stats::messages::work_thread_activity> *)
             &local_28,args,args_1,args_2,args_3);
  local_18 = &stats::messages::work_thread_activity::typeinfo;
  ensure_message_with_actual_data<so_5::stats::messages::work_thread_activity>(local_28);
  (*(local_28->super_message_t)._vptr_message_t[4])(local_28,0);
  local_20 = local_28;
  local_28 = (work_thread_activity *)0x0;
  if (local_20 != (work_thread_activity *)0x0) {
    LOCK();
    paVar1 = &(local_20->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  (*paVar2->_vptr_abstract_message_box_t[7])(paVar2,&local_18,&local_20,1);
  if (local_20 != (work_thread_activity *)0x0) {
    LOCK();
    paVar1 = &(local_20->super_message_t).super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_20 != (work_thread_activity *)0x0)) {
      (*(local_20->super_message_t)._vptr_message_t[1])();
    }
    local_20 = (work_thread_activity *)0x0;
  }
  if (local_28 != (work_thread_activity *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}